

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O2

int run_test_we_get_signals_mixed(void)

{
  signal_ctx *ctx;
  signal_ctx *ctx_00;
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  timer_ctx tc;
  signal_ctx sc [4];
  
  loop = uv_default_loop();
  start_timer(loop,0x11,&tc);
  start_watcher(loop,0x11,sc,1);
  ctx = sc + 1;
  start_watcher(loop,0x11,ctx,1);
  sc[0].stop_or_close = CLOSE;
  sc[1].stop_or_close = CLOSE;
  iVar1 = uv_run(loop,UV_RUN_DEFAULT);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    eval_a = (int64_t)tc.ncalls;
    eval_b = 10;
    if (eval_a == 10) {
      eval_a = 1;
      eval_b = (int64_t)sc[0].ncalls;
      if (eval_b == 1) {
        eval_a = 1;
        eval_b = (int64_t)sc[1].ncalls;
        if (eval_b == 1) {
          start_timer(loop,0x11,&tc);
          start_watcher(loop,0x11,sc,1);
          start_watcher(loop,0x11,ctx,1);
          sc[0].stop_or_close = CLOSE;
          sc[1].stop_or_close = CLOSE;
          ctx_00 = sc + 2;
          start_watcher(loop,0x11,ctx_00,0);
          uv_close((uv_handle_t *)&sc[2].handle,(uv_close_cb)0x0);
          iVar1 = uv_run(loop,UV_RUN_DEFAULT);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            eval_a = (int64_t)tc.ncalls;
            eval_b = 10;
            if (eval_a == 10) {
              eval_a = 1;
              eval_b = (int64_t)sc[0].ncalls;
              if (eval_b == 1) {
                eval_a = 1;
                eval_b = (int64_t)sc[1].ncalls;
                if (eval_b == 1) {
                  eval_a = (int64_t)sc[2].ncalls;
                  eval_b = 0;
                  if (eval_a == 0) {
                    start_timer(loop,0x11,&tc);
                    start_watcher(loop,0x11,sc,0);
                    start_watcher(loop,0x11,ctx,0);
                    sc[0].stop_or_close = CLOSE;
                    sc[1].stop_or_close = CLOSE;
                    start_watcher(loop,0x11,ctx_00,1);
                    uv_close((uv_handle_t *)&sc[2].handle,(uv_close_cb)0x0);
                    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
                    eval_a = (int64_t)iVar1;
                    eval_b = 0;
                    if (eval_a == 0) {
                      eval_a = (int64_t)tc.ncalls;
                      eval_b = 10;
                      if (eval_a == 10) {
                        eval_a = (int64_t)sc[0].ncalls;
                        eval_b = 10;
                        if (eval_a == 10) {
                          eval_a = (int64_t)sc[1].ncalls;
                          eval_b = 10;
                          if (eval_a == 10) {
                            eval_a = (int64_t)sc[2].ncalls;
                            eval_b = 0;
                            if (eval_a == 0) {
                              start_timer(loop,0x11,&tc);
                              start_watcher(loop,0x11,sc,0);
                              start_watcher(loop,0x11,ctx,0);
                              start_watcher(loop,0x11,ctx_00,1);
                              start_watcher(loop,0x11,sc + 3,1);
                              sc[2].stop_or_close = CLOSE;
                              sc[3].stop_or_close = CLOSE;
                              uv_close((uv_handle_t *)&sc[0].handle,(uv_close_cb)0x0);
                              uv_close((uv_handle_t *)&sc[1].handle,(uv_close_cb)0x0);
                              iVar1 = uv_run(loop,UV_RUN_DEFAULT);
                              eval_a = (int64_t)iVar1;
                              eval_b = 0;
                              if (eval_a == 0) {
                                eval_a = (int64_t)tc.ncalls;
                                eval_b = 10;
                                if (eval_a == 10) {
                                  eval_a = (int64_t)sc[0].ncalls;
                                  eval_b = 0;
                                  if (eval_a == 0) {
                                    eval_a = (int64_t)sc[1].ncalls;
                                    eval_b = 0;
                                    if (eval_a == 0) {
                                      eval_a = 1;
                                      eval_b = (int64_t)sc[2].ncalls;
                                      if (eval_b == 1) {
                                        start_timer(loop,0x11,&tc);
                                        start_watcher(loop,0x11,sc,0);
                                        start_watcher(loop,0x11,ctx,1);
                                        start_watcher(loop,0x11,sc + 2,0);
                                        start_watcher(loop,0x11,sc + 3,0);
                                        sc[3].stop_or_close = CLOSE;
                                        uv_close((uv_handle_t *)&sc[0].handle,(uv_close_cb)0x0);
                                        uv_close((uv_handle_t *)&sc[2].handle,(uv_close_cb)0x0);
                                        iVar1 = uv_run(loop,UV_RUN_DEFAULT);
                                        eval_a = (int64_t)iVar1;
                                        eval_b = 0;
                                        if (eval_a == 0) {
                                          eval_a = (int64_t)tc.ncalls;
                                          eval_b = 10;
                                          if (eval_a == 10) {
                                            eval_a = (int64_t)sc[0].ncalls;
                                            eval_b = 0;
                                            if (eval_a == 0) {
                                              eval_a = 1;
                                              eval_b = (int64_t)sc[1].ncalls;
                                              if (eval_b == 1) {
                                                eval_a = (int64_t)sc[2].ncalls;
                                                eval_b = 0;
                                                if (eval_a == 0) {
                                                  eval_a = (int64_t)sc[3].ncalls;
                                                  eval_b = 10;
                                                  if (eval_a == 10) {
                                                    close_loop(loop);
                                                    eval_a = 0;
                                                    iVar1 = uv_loop_close(loop);
                                                    eval_b = (int64_t)iVar1;
                                                    if (eval_b == 0) {
                                                      uv_library_shutdown();
                                                      return 0;
                                                    }
                                                    pcVar4 = "uv_loop_close(loop)";
                                                    pcVar3 = "0";
                                                    uVar2 = 0x144;
                                                  }
                                                  else {
                                                    pcVar4 = "10";
                                                    pcVar3 = "sc[3].ncalls";
                                                    uVar2 = 0x142;
                                                  }
                                                }
                                                else {
                                                  pcVar4 = "0";
                                                  pcVar3 = "sc[2].ncalls";
                                                  uVar2 = 0x141;
                                                }
                                              }
                                              else {
                                                pcVar4 = "sc[1].ncalls";
                                                pcVar3 = "1";
                                                uVar2 = 0x140;
                                              }
                                            }
                                            else {
                                              pcVar4 = "0";
                                              pcVar3 = "sc[0].ncalls";
                                              uVar2 = 0x13f;
                                            }
                                          }
                                          else {
                                            pcVar4 = "10";
                                            pcVar3 = "tc.ncalls";
                                            uVar2 = 0x13e;
                                          }
                                        }
                                        else {
                                          pcVar4 = "0";
                                          pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
                                          uVar2 = 0x13d;
                                        }
                                      }
                                      else {
                                        pcVar4 = "sc[2].ncalls";
                                        pcVar3 = "1";
                                        uVar2 = 0x131;
                                      }
                                    }
                                    else {
                                      pcVar4 = "0";
                                      pcVar3 = "sc[1].ncalls";
                                      uVar2 = 0x130;
                                    }
                                  }
                                  else {
                                    pcVar4 = "0";
                                    pcVar3 = "sc[0].ncalls";
                                    uVar2 = 0x12f;
                                  }
                                }
                                else {
                                  pcVar4 = "10";
                                  pcVar3 = "tc.ncalls";
                                  uVar2 = 0x12e;
                                }
                              }
                              else {
                                pcVar4 = "0";
                                pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
                                uVar2 = 0x12d;
                              }
                            }
                            else {
                              pcVar4 = "0";
                              pcVar3 = "sc[2].ncalls";
                              uVar2 = 0x121;
                            }
                          }
                          else {
                            pcVar4 = "10";
                            pcVar3 = "sc[1].ncalls";
                            uVar2 = 0x120;
                          }
                        }
                        else {
                          pcVar4 = "10";
                          pcVar3 = "sc[0].ncalls";
                          uVar2 = 0x11f;
                        }
                      }
                      else {
                        pcVar4 = "10";
                        pcVar3 = "tc.ncalls";
                        uVar2 = 0x11e;
                      }
                    }
                    else {
                      pcVar4 = "0";
                      pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
                      uVar2 = 0x11d;
                    }
                  }
                  else {
                    pcVar4 = "0";
                    pcVar3 = "sc[2].ncalls";
                    uVar2 = 0x113;
                  }
                }
                else {
                  pcVar4 = "sc[1].ncalls";
                  pcVar3 = "1";
                  uVar2 = 0x112;
                }
              }
              else {
                pcVar4 = "sc[0].ncalls";
                pcVar3 = "1";
                uVar2 = 0x111;
              }
            }
            else {
              pcVar4 = "10";
              pcVar3 = "tc.ncalls";
              uVar2 = 0x110;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
            uVar2 = 0x10f;
          }
        }
        else {
          pcVar4 = "sc[1].ncalls";
          pcVar3 = "1";
          uVar2 = 0x105;
        }
      }
      else {
        pcVar4 = "sc[0].ncalls";
        pcVar3 = "1";
        uVar2 = 0x104;
      }
    }
    else {
      pcVar4 = "10";
      pcVar3 = "tc.ncalls";
      uVar2 = 0x103;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_run(loop, UV_RUN_DEFAULT)";
    uVar2 = 0x102;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-signal.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(we_get_signals_mixed) {
  struct signal_ctx sc[4];
  struct timer_ctx tc;
  uv_loop_t* loop;

  loop = uv_default_loop();

  /* 2 one-shot */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 1);
  start_watcher(loop, SIGCHLD, sc + 1, 1);
  sc[0].stop_or_close = CLOSE;
  sc[1].stop_or_close = CLOSE;
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(1, sc[0].ncalls);
  ASSERT_EQ(1, sc[1].ncalls);

  /* 2 one-shot, 1 normal then remove normal */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 1);
  start_watcher(loop, SIGCHLD, sc + 1, 1);
  sc[0].stop_or_close = CLOSE;
  sc[1].stop_or_close = CLOSE;
  start_watcher(loop, SIGCHLD, sc + 2, 0);
  uv_close((uv_handle_t*)&(sc[2]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(1, sc[0].ncalls);
  ASSERT_EQ(1, sc[1].ncalls);
  ASSERT_OK(sc[2].ncalls);

  /* 2 normal, 1 one-shot then remove one-shot */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 0);
  start_watcher(loop, SIGCHLD, sc + 1, 0);
  sc[0].stop_or_close = CLOSE;
  sc[1].stop_or_close = CLOSE;
  start_watcher(loop, SIGCHLD, sc + 2, 1);
  uv_close((uv_handle_t*)&(sc[2]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_EQ(sc[0].ncalls, NSIGNALS);
  ASSERT_EQ(sc[1].ncalls, NSIGNALS);
  ASSERT_OK(sc[2].ncalls);

  /* 2 normal, 2 one-shot then remove 2 normal */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 0);
  start_watcher(loop, SIGCHLD, sc + 1, 0);
  start_watcher(loop, SIGCHLD, sc + 2, 1);
  start_watcher(loop, SIGCHLD, sc + 3, 1);
  sc[2].stop_or_close = CLOSE;
  sc[3].stop_or_close = CLOSE;
  uv_close((uv_handle_t*)&(sc[0]).handle, NULL);
  uv_close((uv_handle_t*)&(sc[1]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_OK(sc[0].ncalls);
  ASSERT_OK(sc[1].ncalls);
  ASSERT_EQ(1, sc[2].ncalls);
  ASSERT_EQ(1, sc[2].ncalls);

  /* 1 normal, 1 one-shot, 2 normal then remove 1st normal, 2nd normal */
  start_timer(loop, SIGCHLD, &tc);
  start_watcher(loop, SIGCHLD, sc + 0, 0);
  start_watcher(loop, SIGCHLD, sc + 1, 1);
  start_watcher(loop, SIGCHLD, sc + 2, 0);
  start_watcher(loop, SIGCHLD, sc + 3, 0);
  sc[3].stop_or_close = CLOSE;
  uv_close((uv_handle_t*)&(sc[0]).handle, NULL);
  uv_close((uv_handle_t*)&(sc[2]).handle, NULL);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(tc.ncalls, NSIGNALS);
  ASSERT_OK(sc[0].ncalls);
  ASSERT_EQ(1, sc[1].ncalls);
  ASSERT_OK(sc[2].ncalls);
  ASSERT_EQ(sc[3].ncalls, NSIGNALS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}